

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O2

void decStatus(decNumber *dn,uint32_t status,decContext *set)

{
  if ((status & 0xdd) != 0) {
    if ((status >> 0x1e & 1) == 0) {
      dn->digits = 1;
      dn->exponent = 0;
      dn->bits = ' ';
      dn->lsu[0] = '\0';
    }
    else {
      status = status & 0xbfffffff;
    }
  }
  uprv_decContextSetStatus_63(set,status);
  return;
}

Assistant:

static void decStatus(decNumber *dn, uInt status, decContext *set) {
  if (status & DEC_NaNs) {              /* error status -> NaN  */
    /* if cause was an sNaN, clear and propagate [NaN is already set up]  */
    if (status & DEC_sNaN) status&=~DEC_sNaN;
     else {
      uprv_decNumberZero(dn);                /* other error: clean throughout  */
      dn->bits=DECNAN;                  /* and make a quiet NaN  */
      }
    }
  uprv_decContextSetStatus(set, status);     /* [may not return]  */
  return;
  }